

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool GlobOpt::DoArrayMissingValueCheckHoist(Func *func)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeProfileInfo *this;
  
  bVar1 = DoArrayCheckHoist(func);
  if (bVar1) {
    sourceContextId = Func::GetSourceContextId(func);
    functionId = Func::GetLocalFunctionId(func);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,ArrayMissingValueCheckHoistPhase,sourceContextId,
                       functionId);
    if (!bVar1) {
      bVar1 = Func::HasProfileInfo(func);
      if (!bVar1) {
        return true;
      }
      this = Func::GetReadOnlyProfileInfo(func);
      bVar1 = Func::IsLoopBody(func);
      bVar1 = JITTimeProfileInfo::IsArrayMissingValueCheckHoistDisabled(this,bVar1);
      return !bVar1;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::DoArrayMissingValueCheckHoist(Func const * const func)
{
    return
        DoArrayCheckHoist(func) &&
        !PHASE_OFF(Js::ArrayMissingValueCheckHoistPhase, func) &&
        (!func->HasProfileInfo() || !func->GetReadOnlyProfileInfo()->IsArrayMissingValueCheckHoistDisabled(func->IsLoopBody()));
}